

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O2

int jas_image_readcmpt(jas_image_t *image,uint cmptno,jas_image_coord_t x,jas_image_coord_t y,
                      jas_image_coord_t width,jas_image_coord_t height,jas_matrix_t *data)

{
  jas_image_cmpt_t *pjVar1;
  jas_stream_t *stream;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  jas_seqent_t jVar9;
  jas_seqent_t *pjVar10;
  long lVar11;
  uint_fast32_t v;
  jas_seqent_t *local_68;
  
  iVar3 = jas_getdbglevel();
  if (99 < iVar3) {
    jas_eprintf("jas_image_readcmpt(%p, %d, %ld, %ld, %ld, %ld, %p)\n",image,(ulong)cmptno,x,y,width
                ,height,data);
  }
  iVar3 = -1;
  if ((data != (jas_matrix_t *)0x0) && (cmptno < image->numcmpts_)) {
    pjVar1 = image->cmpts_[cmptno];
    if ((x < pjVar1->width_) &&
       (((((height + y <= pjVar1->height_ && width + x <= pjVar1->width_) && y < pjVar1->height_ &&
          (data->numrows_ != 0)) && (data->numcols_ != 0)) &&
        ((data->numcols_ == width && data->numrows_ == height ||
         (iVar4 = jas_matrix_resize(data,height,width), iVar4 == 0)))))) {
      local_68 = *data->rows_;
      sVar6 = jas_matrix_rowstep(data);
      lVar11 = 0;
      if (height < 1) {
        height = lVar11;
      }
      for (; lVar11 != height; lVar11 = lVar11 + 1) {
        lVar7 = jas_stream_seek(pjVar1->stream_,
                                (long)pjVar1->cps_ * ((lVar11 + y) * pjVar1->width_ + x),0);
        lVar8 = width;
        pjVar10 = local_68;
        if (lVar7 < 0) {
          return -1;
        }
        for (; 0 < lVar8; lVar8 = lVar8 + -1) {
          v = 0;
          for (iVar3 = pjVar1->cps_; 0 < iVar3; iVar3 = iVar3 + -1) {
            stream = pjVar1->stream_;
            if ((stream->flags_ & 7U) != 0) {
              return -1;
            }
            if ((-1 < stream->rwlimit_) && (stream->rwlimit_ <= stream->rwcnt_)) {
              stream->flags_ = stream->flags_ | 4;
              return -1;
            }
            iVar4 = stream->cnt_;
            stream->cnt_ = iVar4 + -1;
            if (iVar4 < 1) {
              uVar5 = jas_stream_fillbuf(stream,1);
              if (uVar5 == 0xffffffff) {
                return -1;
              }
            }
            else {
              stream->rwcnt_ = stream->rwcnt_ + 1;
              pbVar2 = stream->ptr_;
              stream->ptr_ = pbVar2 + 1;
              uVar5 = (uint)*pbVar2;
            }
            v = v << 8 | (ulong)(uVar5 & 0xff);
          }
          jVar9 = bitstoint(v,pjVar1->prec_,pjVar1->sgnd_ != 0);
          *pjVar10 = jVar9;
          pjVar10 = pjVar10 + 1;
        }
        local_68 = local_68 + (int)sVar6;
      }
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int jas_image_readcmpt(jas_image_t *image, unsigned cmptno, jas_image_coord_t x,
  jas_image_coord_t y, jas_image_coord_t width, jas_image_coord_t height,
  jas_matrix_t *data)
{
	jas_image_cmpt_t *cmpt;
	jas_image_coord_t i;
	jas_image_coord_t j;
	int k;
	jas_seqent_t v;
	int c;
	jas_seqent_t *dr;
	jas_seqent_t *d;
	int drs;

	JAS_DBGLOG(100, ("jas_image_readcmpt(%p, %d, %ld, %ld, %ld, %ld, %p)\n",
	  image, cmptno, JAS_CAST(long, x), JAS_CAST(long, y),
	  JAS_CAST(long, width), JAS_CAST(long, height), data));

	if(data == NULL) {
		return -1;
	}

	if (cmptno >= image->numcmpts_) {
		return -1;
	}

	cmpt = image->cmpts_[cmptno];
	if (x >= cmpt->width_ || y >= cmpt->height_ ||
	  x + width > cmpt->width_ ||
	  y + height > cmpt->height_) {
		return -1;
	}

	if (!jas_matrix_numrows(data) || !jas_matrix_numcols(data)) {
		return -1;
	}

	if (jas_matrix_numrows(data) != height || jas_matrix_numcols(data) != width) {
		if (jas_matrix_resize(data, height, width)) {
			return -1;
		}
	}

	dr = jas_matrix_getref(data, 0, 0);
	drs = jas_matrix_rowstep(data);
	for (i = 0; i < height; ++i, dr += drs) {
		d = dr;
		if (jas_stream_seek(cmpt->stream_, (cmpt->width_ * (y + i) + x)
		  * cmpt->cps_, SEEK_SET) < 0) {
			return -1;
		}
		for (j = width; j > 0; --j, ++d) {
			v = 0;
			for (k = cmpt->cps_; k > 0; --k) {
				if ((c = jas_stream_getc(cmpt->stream_)) == EOF) {
					return -1;
				}
				v = (v << 8) | (c & 0xff);
			}
			*d = bitstoint(v, cmpt->prec_, cmpt->sgnd_);
		}
	}

	return 0;
}